

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall
chrono::ChParticleCloud::IntStateScatter
          (ChParticleCloud *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T,
          bool full_update)

{
  ChAparticle *pCVar1;
  pointer ppCVar2;
  ulong uVar3;
  uint uVar4;
  ChCoordsys<double> local_a0;
  double *local_68;
  undefined8 local_60;
  ChState *local_50;
  ulong local_48;
  long local_38;
  
  ppCVar2 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar2) {
    uVar4 = 1;
    uVar3 = 0;
    do {
      pCVar1 = ppCVar2[uVar3];
      local_48 = (ulong)off_x;
      local_68 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 local_48;
      local_38 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_60 = 7;
      local_50 = x;
      if (local_38 + -7 < (long)local_48) {
LAB_005379c7:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      ChCoordsys<double>::
      ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_a0,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_68,(type *)0x0);
      ChFrame<double>::SetCoord((ChFrame<double> *)pCVar1,&local_a0);
      pCVar1 = (this->particles).
               super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar3];
      local_a0.rot.m_data[1] = (double)(ulong)off_v;
      local_a0.pos.m_data[0] =
           (double)((v->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + (long)local_a0.rot.m_data[1]);
      local_a0.rot.m_data[3] =
           (double)(v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_a0.pos.m_data[1] = 1.48219693752374e-323;
      local_a0.rot.m_data[0] = (double)v;
      if ((long)local_a0.rot.m_data[3] + -3 < (long)local_a0.rot.m_data[1]) goto LAB_005379c7;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                ((ChVector<double> *)&local_68,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_a0,(type *)0x0);
      (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                             super_ChFrame<double> + 0x38))
                (pCVar1,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)&local_68);
      pCVar1 = (this->particles).
               super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar3];
      local_a0.rot.m_data[1] = (double)(ulong)(off_v + 3);
      local_a0.pos.m_data[0] =
           (double)((v->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + (long)local_a0.rot.m_data[1]);
      local_a0.rot.m_data[3] =
           (double)(v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_a0.pos.m_data[1] = 1.48219693752374e-323;
      local_a0.rot.m_data[0] = (double)v;
      if ((long)local_a0.rot.m_data[3] + -3 < (long)local_a0.rot.m_data[1]) goto LAB_005379c7;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                ((ChVector<double> *)&local_68,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_a0,(type *)0x0);
      (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                             super_ChFrame<double> + 0x48))
                (pCVar1,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)&local_68);
      uVar3 = (ulong)uVar4;
      ppCVar2 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      off_x = off_x + 7;
      off_v = off_v + 6;
      uVar4 = uVar4 + 1;
    } while (uVar3 < (ulong)((long)(this->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3))
    ;
  }
  (this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj.ChTime = T;
  (*(this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x13])
            (this,(ulong)full_update);
  return;
}

Assistant:

void ChParticleCloud::IntStateScatter(const unsigned int off_x,  // offset in x state vector
                                        const ChState& x,          // state vector, position part
                                        const unsigned int off_v,  // offset in v state vector
                                        const ChStateDelta& v,     // state vector, speed part
                                        const double T,            // time
                                        bool full_update           // perform complete update
) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        particles[j]->SetCoord(x.segment(off_x + 7 * j, 7));
        particles[j]->SetPos_dt(v.segment(off_v + 6 * j, 3));
        particles[j]->SetWvel_loc(v.segment(off_v + 6 * j + 3, 3));
    }
    SetChTime(T);
    Update(T, full_update);
}